

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double cosine_pdf(double x,double a,double b)

{
  double dVar1;
  double y;
  double r8_pi;
  double pdf;
  double b_local;
  double a_local;
  double x_local;
  
  if (b * -3.141592653589793 + a <= x) {
    if (b * 3.141592653589793 + a < x) {
      r8_pi = 0.0;
    }
    else {
      dVar1 = cos((x - a) / b);
      r8_pi = (1.0 / (b * 6.283185307179586)) * dVar1;
    }
  }
  else {
    r8_pi = 0.0;
  }
  return r8_pi;
}

Assistant:

double cosine_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    COSINE_PDF evaluates the Cosine PDF.
//
//  Discussion:
//
//    PDF(A,B;X) = ( 1 / ( 2 * PI * B ) ) * COS ( ( X - A ) / B )
//    for A - PI * B <= X <= A + PI * B
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Output, double PDF, the value of the PDF.
//
{
  double pdf = 0.0;
  const double r8_pi = 3.14159265358979323;
  double y;

  if ( x < a - r8_pi * b )
  {
    pdf = 0.0;
  }
  else if ( x <= a + r8_pi * b )
  {
    y = ( x - a ) / b;

    pdf = 1.0 / ( 2.0 * r8_pi * b ) * cos ( y );
  }
  else if ( a + r8_pi * b < x )
  {
    pdf = 0.0;
  }

  return pdf;
}